

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O3

void __thiscall xray_re::xr_motion::save(xr_motion *this,xr_writer *w)

{
  int32_t local_1c;
  int32_t local_18;
  float local_14;
  
  xr_writer::w_sz(w,&this->m_name);
  local_1c = this->m_frame_start;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_18 = this->m_frame_end;
  (*w->_vptr_xr_writer[2])(w,&local_18,4);
  local_14 = this->m_fps;
  (*w->_vptr_xr_writer[2])(w,&local_14,4);
  return;
}

Assistant:

void xr_motion::save(xr_writer& w) const
{
	w.w_sz(m_name);
	w.w_s32(m_frame_start);
	w.w_s32(m_frame_end);
	w.w_float(m_fps);
}